

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

void __thiscall re2::PCRE::PCRE(PCRE *this,char *pattern)

{
  char *pattern_local;
  PCRE *this_local;
  
  std::__cxx11::string::string((string *)this);
  Init(this,pattern,EnabledExecOptions,0,0,true);
  return;
}

Assistant:

PCRE::PCRE(const char* pattern) {
  Init(pattern, None, 0, 0, true);
}